

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedFunctions.cpp
# Opt level: O1

bool Refal2::embeddedCvd(CExecutionContext *executionContext)

{
  CNodeType *fromNode;
  bool bVar1;
  _Alloc_hider _Var2;
  string text;
  CArbitraryInteger number;
  string local_78;
  CUnit local_58;
  CArbitraryInteger local_48;
  
  CArbitraryInteger::CArbitraryInteger(&local_48);
  bVar1 = readNumber(&executionContext->Argument,&local_48);
  if (bVar1) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    CArbitraryInteger::GetTextValue(&local_48,&local_78);
    fromNode = (executionContext->Argument).super_CNodeList<Refal2::CUnit>.first;
    if (fromNode != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                ((CNodeList<Refal2::CUnit> *)executionContext,fromNode,
                 (executionContext->Argument).super_CNodeList<Refal2::CUnit>.last);
    }
    (executionContext->Argument).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (executionContext->Argument).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
    if (local_78._M_string_length != 0) {
      _Var2._M_p = local_78._M_dataplus._M_p;
      do {
        local_58.field_1.c = *_Var2._M_p;
        local_58.type = UT_Char;
        CNodeList<Refal2::CUnit>::Append((CNodeList<Refal2::CUnit> *)executionContext,&local_58);
        _Var2._M_p = _Var2._M_p + 1;
      } while (_Var2._M_p != local_78._M_dataplus._M_p + local_78._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (local_48.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

static bool embeddedCvd( CExecutionContext& executionContext )
{
	DEBUG_PRINT( __FUNCTION__ )
	CArbitraryInteger number;
	if( !readNumber( executionContext.Argument, number ) ) {
		return false;
	}
	std::string text;
	number.GetTextValue( text );
	executionContext.Argument.Empty();
	executionContext.Argument.AppendText( text );
	return true;
}